

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bulk.c
# Opt level: O2

void ecs_bulk_remove_entity(ecs_world_t *world,ecs_entity_t to_remove,ecs_filter_t *filter)

{
  _Bool _Var1;
  int32_t iVar2;
  ecs_stage_t *peVar3;
  ecs_table_t *table;
  ecs_table_t *dst_table;
  int dense_index;
  ecs_world_t *world_local;
  ecs_entities_t removed;
  ecs_entities_t to_remove_array;
  ecs_entity_t to_remove_local;
  ecs_entity_t removed_entity;
  
  world_local = world;
  to_remove_local = to_remove;
  _ecs_assert(world != (ecs_world_t *)0x0,2,(char *)0x0,"world != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
              ,299);
  if (world == (ecs_world_t *)0x0) {
    __assert_fail("world != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
                  ,299,
                  "void ecs_bulk_remove_entity(ecs_world_t *, ecs_entity_t, const ecs_filter_t *)");
  }
  _ecs_assert(to_remove != 0,2,(char *)0x0,"to_remove != 0",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
              ,300);
  if (to_remove != 0) {
    peVar3 = ecs_get_stage(&world_local);
    dense_index = 0;
    _ecs_assert(peVar3 == &world_local->stage,0x23,(char *)0x0,"stage == &world->stage",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
                ,0x12f);
    if (peVar3 != &world_local->stage) {
      __assert_fail("stage == &world->stage",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
                    ,0x12f,
                    "void ecs_bulk_remove_entity(ecs_world_t *, ecs_entity_t, const ecs_filter_t *)"
                   );
    }
    to_remove_array.array = &to_remove_local;
    to_remove_array.count = 1;
    removed.array = &removed_entity;
    removed.count = 0;
    iVar2 = ecs_sparse_count((world_local->store).tables);
    if (iVar2 < 1) {
      iVar2 = dense_index;
    }
    do {
      if (iVar2 == dense_index) {
        return;
      }
      table = (ecs_table_t *)_ecs_sparse_get((world_local->store).tables,0x80,dense_index);
      if ((table->flags & 1) == 0) {
        _Var1 = ecs_table_match_filter(world_local,table,filter);
        if (_Var1) {
          dst_table = ecs_table_traverse_remove(world_local,table,&to_remove_array,&removed);
          _ecs_assert(removed.count <= to_remove_array.count,0xc,(char *)0x0,
                      "removed.count <= to_remove_array.count",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
                      ,0x149);
          if (to_remove_array.count < removed.count) {
            __assert_fail("removed.count <= to_remove_array.count",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
                          ,0x149,
                          "void ecs_bulk_remove_entity(ecs_world_t *, ecs_entity_t, const ecs_filter_t *)"
                         );
          }
          if (removed.count != 0) {
            _ecs_assert(dst_table != (ecs_table_t *)0x0,0xc,(char *)0x0,"dst_table != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
                        ,0x14f);
            if (dst_table == (ecs_table_t *)0x0) {
              __assert_fail("dst_table != ((void*)0)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
                            ,0x14f,
                            "void ecs_bulk_remove_entity(ecs_world_t *, ecs_entity_t, const ecs_filter_t *)"
                           );
            }
            merge_table(world_local,dst_table,table,(ecs_entities_t *)0x0,&removed);
            removed.count = 0;
          }
        }
      }
      dense_index = dense_index + 1;
    } while( true );
  }
  __assert_fail("to_remove != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
                ,300,
                "void ecs_bulk_remove_entity(ecs_world_t *, ecs_entity_t, const ecs_filter_t *)");
}

Assistant:

void ecs_bulk_remove_entity(
    ecs_world_t *world,
    ecs_entity_t to_remove,
    const ecs_filter_t *filter)
{
    ecs_assert(world != NULL, ECS_INVALID_PARAMETER, NULL);
    ecs_assert(to_remove != 0, ECS_INVALID_PARAMETER, NULL);

    ecs_stage_t *stage = ecs_get_stage(&world);
    ecs_assert(stage == &world->stage, ECS_UNSUPPORTED, NULL);
    (void)stage;

    ecs_entities_t to_remove_array = { .array = &to_remove, .count = 1 };

    ecs_entity_t removed_entity;
    ecs_entities_t removed = {
        .array = &removed_entity,
        .count = 0
    };

    int32_t i, count = ecs_sparse_count(world->store.tables);
    for (i = 0; i < count; i ++) {
        ecs_table_t *table = ecs_sparse_get(world->store.tables, ecs_table_t, i);

        if (table->flags & EcsTableHasBuiltins) {
            continue;
        }

        if (!ecs_table_match_filter(world, table, filter)) {
            continue;
        }            

        ecs_table_t *dst_table = ecs_table_traverse_remove(
            world, table, &to_remove_array, &removed);

        ecs_assert(removed.count <= to_remove_array.count, ECS_INTERNAL_ERROR, NULL);

        if (!removed.count) {
            continue;
        }

        ecs_assert(dst_table != NULL, ECS_INTERNAL_ERROR, NULL);   
        merge_table(world, dst_table, table, NULL, &removed);
        removed.count = 0;        
    }    
}